

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O3

v256 * v256_shl_8(v256 *__return_storage_ptr__,v256 a,uint c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2 = pshufb(ZEXT416((uint)(0xff << ((byte)c & 0x1f))),(undefined1  [16])0x0);
  auVar1 = psllw((undefined1  [16])a.val[1],ZEXT416(c));
  auVar3 = psllw((undefined1  [16])a.val[0],ZEXT416(c));
  __return_storage_ptr__->val[1] = (v128)(auVar1 & auVar2);
  __return_storage_ptr__->val[0] = (v128)(auVar3 & auVar2);
  return __return_storage_ptr__;
}

Assistant:

SIMD_INLINE v256 v256_shl_8(v256 a, const unsigned int c) {
  return v256_from_v128(v128_shl_8(a.val[1], c), v128_shl_8(a.val[0], c));
}